

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

CommonTableExpressionMap * duckdb::CommonTableExpressionMap::Deserialize(Deserializer *deserializer)

{
  CommonTableExpressionMap *in_RDI;
  CommonTableExpressionMap *result;
  InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
  *in_stack_00000068;
  char *in_stack_00000070;
  field_id_t in_stack_0000007e;
  Deserializer *in_stack_00000080;
  
  CommonTableExpressionMap((CommonTableExpressionMap *)0xada324);
  Deserializer::
  ReadPropertyWithDefault<duckdb::InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,std::default_delete<duckdb::CommonTableExpressionInfo>,true>>>
            (in_stack_00000080,in_stack_0000007e,in_stack_00000070,in_stack_00000068);
  return in_RDI;
}

Assistant:

CommonTableExpressionMap CommonTableExpressionMap::Deserialize(Deserializer &deserializer) {
	CommonTableExpressionMap result;
	deserializer.ReadPropertyWithDefault<InsertionOrderPreservingMap<unique_ptr<CommonTableExpressionInfo>>>(100, "map", result.map);
	return result;
}